

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O3

void __thiscall
duckdb::PartitionGlobalMergeState::PartitionGlobalMergeState
          (PartitionGlobalMergeState *this,PartitionGlobalSinkState *sink)

{
  value_type vVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  int32_t val;
  TaskScheduler *this_00;
  unsigned_long uVar3;
  reference pvVar4;
  pointer pPVar5;
  reference pvVar6;
  
  this->sink = sink;
  (this->group_data).
  super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
  .super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>._M_head_impl =
       (TupleDataCollection *)0x0;
  this->group_idx = 0;
  (this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pvVar2 = &(this->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>;
  (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->chunk_state).scan_state.pin_state.row_handles.handles.
    super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
    .
    super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
    ._M_impl = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->chunk_state).scan_state.pin_state.row_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
   + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->chunk_state).scan_state.pin_state.heap_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
   + 8) = (undefined1  [16])0x0;
  (this->chunk_state).scan_state.pin_state.properties = INVALID;
  TupleDataChunkState::TupleDataChunkState(&(this->chunk_state).scan_state.chunk_state);
  *(undefined4 *)&(this->chunk_state).scan_state.segment_index = 0xffffffff;
  *(undefined4 *)((long)&(this->chunk_state).scan_state.segment_index + 4) = 0xffffffff;
  *(undefined4 *)&(this->chunk_state).scan_state.chunk_index = 0xffffffff;
  *(undefined4 *)((long)&(this->chunk_state).scan_state.chunk_index + 4) = 0xffffffff;
  *(undefined1 (*) [16])&(this->chunk_state).lock.super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->chunk_state).lock.super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  (this->chunk_state).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->memory_per_thread = sink->memory_per_thread;
  this_00 = TaskScheduler::GetScheduler(sink->context);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  this->num_threads = uVar3;
  *(undefined1 (*) [16])&(this->lock).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->lock).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->lock).super___mutex_base._M_mutex.__data.__list.__prev + 1) =
       (undefined1  [16])0x0;
  this->total_tasks = 0;
  this->tasks_assigned = 0;
  this->tasks_completed = 0;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
           ::operator[](&sink->hash_groups,this->group_idx);
  this->hash_group =
       (pvVar4->
       super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
       .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
  pvVar4 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
           ::operator[](&sink->hash_groups,this->group_idx);
  pPVar5 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
           ::operator->(pvVar4);
  this->global_sort =
       (GlobalSortState *)
       (pPVar5->global_sort).
       super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
       .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>;
  vVar1 = this->group_idx;
  pvVar6 = vector<unsigned_long,_true>::operator[](&sink->bin_groups,0);
  *pvVar6 = vVar1;
  return;
}

Assistant:

PartitionGlobalMergeState::PartitionGlobalMergeState(PartitionGlobalSinkState &sink)
    : sink(sink), group_idx(0), memory_per_thread(sink.memory_per_thread),
      num_threads(NumericCast<idx_t>(TaskScheduler::GetScheduler(sink.context).NumberOfThreads())),
      stage(PartitionSortStage::INIT), total_tasks(0), tasks_assigned(0), tasks_completed(0) {

	const hash_t hash_bin = 0;
	hash_group = sink.hash_groups[group_idx].get();
	global_sort = sink.hash_groups[group_idx]->global_sort.get();

	sink.bin_groups[hash_bin] = group_idx;
}